

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O0

bool __thiscall despot::util::tinyxml::TiXmlText::Blank(TiXmlText *this)

{
  bool bVar1;
  size_type sVar2;
  char *pcVar3;
  uint local_1c;
  uint i;
  TiXmlText *this_local;
  
  local_1c = 0;
  while( true ) {
    sVar2 = TiXmlString::length(&(this->super_TiXmlNode).value);
    if (sVar2 <= local_1c) {
      return true;
    }
    pcVar3 = TiXmlString::operator[](&(this->super_TiXmlNode).value,(ulong)local_1c);
    bVar1 = TiXmlBase::IsWhiteSpace(*pcVar3);
    if (!bVar1) break;
    local_1c = local_1c + 1;
  }
  return false;
}

Assistant:

bool TiXmlText::Blank() const {
	for (unsigned i = 0; i < value.length(); i++)
		if (!IsWhiteSpace(value[i]))
			return false;
	return true;
}